

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_column_writer.cpp
# Opt level: O0

void __thiscall
duckdb::PrimitiveColumnWriter::NextPage
          (PrimitiveColumnWriter *this,PrimitiveColumnWriterState *state)

{
  pointer pbVar1;
  pointer pbVar2;
  size_type sVar3;
  reference pvVar4;
  PrimitiveColumnWriter *in_RSI;
  ColumnWriter *in_RDI;
  MemoryStream *temp_writer;
  value_type *write_info;
  value_type *page_info;
  idx_t in_stack_00000838;
  idx_t in_stack_00000840;
  idx_t in_stack_00000848;
  unsafe_vector<uint16_t> *in_stack_00000850;
  WriteStream *in_stack_00000858;
  optional_idx in_stack_00000860;
  size_type in_stack_ffffffffffffff68;
  vector<duckdb::PageInformation,_true> *in_stack_ffffffffffffff70;
  optional_idx local_30;
  type local_28;
  reference local_20;
  PrimitiveColumnWriterState *in_stack_ffffffffffffffe8;
  
  if (in_RSI[3].super_ColumnWriter.schema_path.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    FlushPage(in_RSI,in_stack_ffffffffffffffe8);
  }
  pbVar1 = in_RSI[3].super_ColumnWriter.schema_path.
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (pointer)std::
                    vector<duckdb::PageWriteInformation,_std::allocator<duckdb::PageWriteInformation>_>
                    ::size((vector<duckdb::PageWriteInformation,_std::allocator<duckdb::PageWriteInformation>_>
                            *)&in_RSI[2].super_ColumnWriter.can_have_nulls);
  if (pbVar1 < pbVar2) {
    pvVar4 = vector<duckdb::PageInformation,_true>::operator[]
                       (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    local_20 = vector<duckdb::PageWriteInformation,_true>::operator[]
                         ((vector<duckdb::PageWriteInformation,_true> *)in_stack_ffffffffffffff70,
                          in_stack_ffffffffffffff68);
    in_RSI[3].super_ColumnWriter.schema_path.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         in_RSI[3].super_ColumnWriter.schema_path.
         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start + 1;
    local_28 = unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>,_true>::
               operator*((unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>,_true>
                          *)in_stack_ffffffffffffff70);
    ColumnWriter::MaxRepeat(in_RDI);
    optional_idx::optional_idx(&local_30);
    WriteLevels(in_stack_00000858,in_stack_00000850,in_stack_00000848,in_stack_00000840,
                in_stack_00000838,in_stack_00000860);
    ColumnWriter::MaxDefine(in_RDI);
    optional_idx::optional_idx((optional_idx *)pvVar4->row_count,pvVar4->offset);
    WriteLevels(in_stack_00000858,in_stack_00000850,in_stack_00000848,in_stack_00000840,
                in_stack_00000838,in_stack_00000860);
  }
  else {
    sVar3 = std::vector<duckdb::PageWriteInformation,_std::allocator<duckdb::PageWriteInformation>_>
            ::size((vector<duckdb::PageWriteInformation,_std::allocator<duckdb::PageWriteInformation>_>
                    *)&in_RSI[2].super_ColumnWriter.can_have_nulls);
    in_RSI[3].super_ColumnWriter.schema_path.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)(sVar3 + 1);
  }
  return;
}

Assistant:

void PrimitiveColumnWriter::NextPage(PrimitiveColumnWriterState &state) {
	if (state.current_page > 0) {
		// need to flush the current page
		FlushPage(state);
	}
	if (state.current_page >= state.write_info.size()) {
		state.current_page = state.write_info.size() + 1;
		return;
	}
	auto &page_info = state.page_info[state.current_page];
	auto &write_info = state.write_info[state.current_page];
	state.current_page++;

	auto &temp_writer = *write_info.temp_writer;

	// write the repetition levels
	WriteLevels(temp_writer, state.repetition_levels, MaxRepeat(), page_info.offset, page_info.row_count);

	// write the definition levels
	WriteLevels(temp_writer, state.definition_levels, MaxDefine(), page_info.offset, page_info.row_count,
	            state.null_count + state.parent_null_count);
}